

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFPageObjectHelper::getAnnotations
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFPageObjectHelper *this,string *only_subtype)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPDFObjectHandle annot;
  QPDFObjectHandle annots;
  allocator<char> local_79;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *local_78;
  undefined1 local_70 [32];
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *)
             __return_storage_ptr__;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Annots",&local_79);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_70 + 0x10),(string *)local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_70 + 0x10));
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_70 + 0x10));
    iVar3 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_70,(int)local_70 + 0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_79);
      bVar1 = QPDFObjectHandle::isDictionaryOfType
                        ((QPDFObjectHandle *)local_70,&local_50,only_subtype);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
        emplace_back<QPDFObjectHandle&>(local_78,(QPDFObjectHandle *)local_70);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
  return (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)local_78
  ;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFPageObjectHelper::getAnnotations(std::string const& only_subtype)
{
    std::vector<QPDFAnnotationObjectHelper> result;
    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        int nannots = annots.getArrayNItems();
        for (int i = 0; i < nannots; ++i) {
            QPDFObjectHandle annot = annots.getArrayItem(i);
            if (annot.isDictionaryOfType("", only_subtype)) {
                result.emplace_back(annot);
            }
        }
    }
    return result;
}